

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

void jsondec_consumews(jsondec *d)

{
  byte bVar1;
  byte *pbVar2;
  
  pbVar2 = (byte *)d->ptr;
  do {
    if (pbVar2 == (byte *)d->end) {
      return;
    }
    bVar1 = *pbVar2;
    if (bVar1 < 0xd) {
      if (bVar1 != 9) {
        if (bVar1 != 10) {
          return;
        }
        d->line = d->line + 1;
        d->line_begin = (char *)pbVar2;
      }
    }
    else if ((bVar1 != 0xd) && (bVar1 != 0x20)) {
      return;
    }
    pbVar2 = pbVar2 + 1;
    d->ptr = (char *)pbVar2;
  } while( true );
}

Assistant:

static void jsondec_consumews(jsondec* d) {
  while (d->ptr != d->end) {
    switch (*d->ptr) {
      case '\n':
        d->line++;
        d->line_begin = d->ptr;
        /* Fallthrough. */
      case '\r':
      case '\t':
      case ' ':
        d->ptr++;
        break;
      default:
        return;
    }
  }
}